

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDComponentList::Internal_Create
          (ON_SubDComponentList *this,ON_SubD *subd,bool bAddVertices,bool bAddEdges,bool bAddFaces,
          bool bComponentInListMark,uint marked_component_count)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ON__UINT64 OVar4;
  uint local_140;
  uint local_13c;
  uint local_138;
  ON_SubDComponentPtr local_118;
  ON_SubDFace *local_110;
  ON_SubDFace *f;
  ON_SubDFaceIterator fit;
  ON_SubDEdge *local_c8;
  ON_SubDEdge *e;
  ON_SubDEdgeIterator eit;
  ON_SubDVertex *local_70;
  ON_SubDVertex *v;
  ON_SubDVertexIterator vit;
  uint vertex_count;
  uint edge_count;
  uint face_count;
  bool bComponentInListMark_local;
  bool bAddFaces_local;
  bool bAddEdges_local;
  bool bAddVertices_local;
  ON_SubD *subd_local;
  ON_SubDComponentList *this_local;
  
  Destroy(this);
  if (marked_component_count == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (bAddFaces) {
      local_138 = ON_SubD::FaceCount(subd);
    }
    else {
      local_138 = 0;
    }
    if (bAddEdges) {
      local_13c = ON_SubD::EdgeCount(subd);
    }
    else {
      local_13c = 0;
    }
    vit.m_component_ptr.m_ptr._4_4_ = local_13c;
    if (bAddVertices) {
      local_140 = ON_SubD::VertexCount(subd);
    }
    else {
      local_140 = 0;
    }
    vit.m_component_ptr.m_ptr._0_4_ = local_140;
    if (((local_140 == 0) && (vit.m_component_ptr.m_ptr._4_4_ == 0)) && (local_138 == 0)) {
      this_local._4_4_ = 0;
    }
    else if (local_140 + vit.m_component_ptr.m_ptr._4_4_ + local_138 < marked_component_count) {
      this_local._4_4_ = 0;
    }
    else {
      bVar1 = (bool)(-bComponentInListMark & 1);
      ON_SimpleArray<ON_SubDComponentPtr>::Reserve
                (&this->m_component_list,(ulong)marked_component_count);
      ON_SimpleArray<ON_SubDComponentPtr>::SetCount(&this->m_component_list,0);
      if ((uint)vit.m_component_ptr.m_ptr != 0) {
        ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&v,subd);
        local_70 = ON_SubDVertexIterator::FirstVertex((ON_SubDVertexIterator *)&v);
        while (local_70 != (ON_SubDVertex *)0x0) {
          bVar2 = ON_ComponentStatus::RuntimeMark(&(local_70->super_ON_SubDComponentBase).m_status);
          if (bVar1 == bVar2) {
            eit.m_component_ptr = ON_SubDVertex::ComponentPtr(local_70);
            ON_SimpleArray<ON_SubDComponentPtr>::Append
                      (&this->m_component_list,&eit.m_component_ptr);
          }
          local_70 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&v);
        }
        ON_SubDVertexIterator::~ON_SubDVertexIterator((ON_SubDVertexIterator *)&v);
      }
      if (vit.m_component_ptr.m_ptr._4_4_ != 0) {
        ON_SubDEdgeIterator::ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e,subd);
        local_c8 = ON_SubDEdgeIterator::FirstEdge((ON_SubDEdgeIterator *)&e);
        while (local_c8 != (ON_SubDEdge *)0x0) {
          bVar2 = ON_ComponentStatus::RuntimeMark(&(local_c8->super_ON_SubDComponentBase).m_status);
          if (bVar1 == bVar2) {
            fit.m_component_ptr = ON_SubDEdge::ComponentPtr(local_c8);
            ON_SimpleArray<ON_SubDComponentPtr>::Append
                      (&this->m_component_list,&fit.m_component_ptr);
          }
          local_c8 = ON_SubDEdgeIterator::NextEdge((ON_SubDEdgeIterator *)&e);
        }
        ON_SubDEdgeIterator::~ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e);
      }
      if (local_138 != 0) {
        ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&f,subd);
        local_110 = ON_SubDFaceIterator::FirstFace((ON_SubDFaceIterator *)&f);
        while (local_110 != (ON_SubDFace *)0x0) {
          bVar2 = ON_ComponentStatus::RuntimeMark(&(local_110->super_ON_SubDComponentBase).m_status)
          ;
          if (bVar1 == bVar2) {
            local_118 = ON_SubDFace::ComponentPtr(local_110);
            ON_SimpleArray<ON_SubDComponentPtr>::Append(&this->m_component_list,&local_118);
          }
          local_110 = ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&f);
        }
        ON_SubDFaceIterator::~ON_SubDFaceIterator((ON_SubDFaceIterator *)&f);
      }
      uVar3 = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount(&this->m_component_list);
      if (uVar3 != 0) {
        ON_SubD::ShareDimple(&this->m_subd,subd);
        OVar4 = ON_SubD::RuntimeSerialNumber(subd);
        this->m_subd_runtime_serial_number = OVar4;
        OVar4 = ON_SubD::GeometryContentSerialNumber(subd);
        this->m_subd_geometry_content_serial_number = OVar4;
        OVar4 = ON_SubD::RenderContentSerialNumber(subd);
        this->m_subd_render_content_serial_number = OVar4;
      }
      this_local._4_4_ = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount(&this->m_component_list)
      ;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned ON_SubDComponentList::Internal_Create(const ON_SubD & subd, bool bAddVertices, bool bAddEdges, bool bAddFaces, bool bComponentInListMark, unsigned marked_component_count)
{
  Destroy();

  if (0 == marked_component_count)
    return 0;

  const unsigned face_count = bAddFaces ? subd.FaceCount() : 0U;
  const unsigned edge_count = bAddEdges ? subd.EdgeCount() : 0U;
  const unsigned vertex_count = bAddVertices ? subd.VertexCount() : 0U;
  if (0 == vertex_count && 0 == edge_count && 0 == face_count)
    return 0;

  if (marked_component_count > vertex_count + edge_count + face_count)
    return 0;

  bComponentInListMark = bComponentInListMark ? true : false;
  m_component_list.Reserve(marked_component_count);
  m_component_list.SetCount(0);
  if (vertex_count > 0)
  {
    ON_SubDVertexIterator vit(subd);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (bComponentInListMark != v->m_status.RuntimeMark())
        continue;
      m_component_list.Append(v->ComponentPtr());
    }
  }
  if (edge_count > 0)
  {
    ON_SubDEdgeIterator eit(subd);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (bComponentInListMark != e->m_status.RuntimeMark())
        continue;
      m_component_list.Append(e->ComponentPtr());
    }
  }
  if (face_count > 0)
  {
    ON_SubDFaceIterator fit(subd);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (bComponentInListMark != f->m_status.RuntimeMark())
        continue;
      m_component_list.Append(f->ComponentPtr());
    }
  }

  if (m_component_list.UnsignedCount() > 0)
  {
    m_subd.ShareDimple(subd);
    m_subd_runtime_serial_number = subd.RuntimeSerialNumber();
    m_subd_geometry_content_serial_number = subd.GeometryContentSerialNumber();
    m_subd_render_content_serial_number = subd.RenderContentSerialNumber();
  }
  return m_component_list.UnsignedCount();
}